

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void qpdf_init_write_internal(qpdf_data qpdf)

{
  element_type *peVar1;
  element_type *peVar2;
  shared_ptr<Buffer> local_30;
  shared_ptr<QPDFWriter> local_20;
  qpdf_data local_10;
  qpdf_data qpdf_local;
  
  local_10 = qpdf;
  peVar1 = std::__shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(qpdf->qpdf_writer).
                       super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>);
  if (peVar1 != (element_type *)0x0) {
    QTC::TC("qpdf","qpdf-c called qpdf_init_write multiple times",0);
    std::shared_ptr<QPDFWriter>::shared_ptr(&local_20,(nullptr_t)0x0);
    std::shared_ptr<QPDFWriter>::operator=(&local_10->qpdf_writer,&local_20);
    std::shared_ptr<QPDFWriter>::~shared_ptr(&local_20);
    peVar2 = std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(local_10->output_buffer).
                         super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
    if (peVar2 != (element_type *)0x0) {
      std::shared_ptr<Buffer>::shared_ptr(&local_30,(nullptr_t)0x0);
      std::shared_ptr<Buffer>::operator=(&local_10->output_buffer,&local_30);
      std::shared_ptr<Buffer>::~shared_ptr(&local_30);
      local_10->write_memory = false;
      local_10->filename = (char *)0x0;
    }
  }
  return;
}

Assistant:

static void
qpdf_init_write_internal(qpdf_data qpdf)
{
    if (qpdf->qpdf_writer.get()) {
        QTC::TC("qpdf", "qpdf-c called qpdf_init_write multiple times");
        qpdf->qpdf_writer = nullptr;
        if (qpdf->output_buffer.get()) {
            qpdf->output_buffer = nullptr;
            qpdf->write_memory = false;
            qpdf->filename = nullptr;
        }
    }
}